

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::TestPlusArgsFunction::TestPlusArgsFunction
          (TestPlusArgsFunction *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_39;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_38;
  Type *local_20;
  
  local_20 = &(builtins->stringType).super_Type;
  __l._M_len = 1;
  __l._M_array = &local_20;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_38,__l,&local_39);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            ((SimpleSystemSubroutine *)this,TestPlusArgs,Function,1,&local_38,
             (Type *)&builtins->intType,false,false);
  (this->super_NonConstantFunction).super_SimpleSystemSubroutine.super_SystemSubroutine.
  _vptr_SystemSubroutine = (_func_int **)&PTR__SimpleSystemSubroutine_00ca1e38;
  if (local_38.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_NonConstantFunction).super_SimpleSystemSubroutine.super_SystemSubroutine.
  _vptr_SystemSubroutine = (_func_int **)&PTR__SimpleSystemSubroutine_00ca5090;
  return;
}

Assistant:

TestPlusArgsFunction(const Builtins& builtins) :
        NonConstantFunction(KnownSystemName::TestPlusArgs, builtins.intType, 1,
                            std::vector<const Type*>{&builtins.stringType}) {}